

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd.cpp
# Opt level: O0

void __thiscall NshCmdSwap_Success_Test::NshCmdSwap_Success_Test(NshCmdSwap_Success_Test *this)

{
  NshCmdSwap_Success_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__NshCmdSwap_Success_Test_001c7b60;
  return;
}

Assistant:

TEST(NshCmdSwap, Success)
{
    nsh_cmd_t cmd_from;
    ASSERT_EQ(nsh_cmd_init(&cmd_from, cmd_test_name, &cmd_test_handler), NSH_STATUS_OK);

    nsh_cmd_t cmd_to;
    ASSERT_EQ(nsh_cmd_init_empty(&cmd_to), NSH_STATUS_OK);

    nsh_cmd_swap(&cmd_to, &cmd_from);

    ASSERT_STREQ(cmd_to.name, cmd_test_name);
    ASSERT_EQ(cmd_to.handler, &cmd_test_handler);
    ASSERT_STREQ(cmd_from.name, "");
    ASSERT_EQ(cmd_from.handler, nullptr);
}